

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O2

BoolExpr * BO_xor(List *ls)

{
  bool bVar1;
  BoolExpr *pBVar2;
  BoolExpr *pBVar3;
  BoolExpr *pBVar4;
  int iVar5;
  
  iVar5 = 0;
  pBVar2 = create_bool_expr(E_XOR,(BoolExpr *)0x0);
  bVar1 = false;
  while (ls = ls->cdr, ls != (List *)0x0) {
    pBVar3 = make_boolean_expr(ls);
    if (pBVar3->type != E_FALSE) {
      if (pBVar3->type == E_TRUE) {
        bVar1 = (bool)(bVar1 ^ 1);
        if (iVar5 == 1) {
          iVar5 = 0;
        }
        else if (iVar5 == 0) {
          iVar5 = 1;
        }
        else {
          pBVar3->next = pBVar2->subexpr;
          pBVar2->subexpr = pBVar3;
        }
      }
      else {
        pBVar3->next = pBVar2->subexpr;
        pBVar2->subexpr = pBVar3;
        iVar5 = 2;
      }
    }
  }
  pBVar3 = pBVar2->subexpr;
  if (pBVar3 == (BoolExpr *)0x0) {
    parse_error((List *)0x0,"xor takes arguments!\n");
  }
  else {
    if (iVar5 == 1) {
      return &true_bool_expr;
    }
    if (iVar5 != 0) {
      pBVar4 = pBVar2;
      if (pBVar3->next == (BoolExprStruct *)0x0) {
        pBVar4 = pBVar3;
      }
      if (!bVar1) {
        return pBVar4;
      }
      pBVar4 = create_bool_expr(E_TRUE,(BoolExpr *)0x0);
      pBVar4->next = pBVar3;
      pBVar2->subexpr = pBVar4;
      return pBVar2;
    }
  }
  return &false_bool_expr;
}

Assistant:

static BoolExpr *
BO_xor (const List *ls)
{
  BoolExpr *subexpr, *ret;
  BoolExprType answer = E_FALSE;
  BOOL odd_trues = NO;

  ret = create_bool_expr (E_XOR, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_TRUE)
	{
	  odd_trues = !odd_trues;

	  if (answer == E_TRUE) answer = E_FALSE;
	  else if (answer == E_FALSE) answer = E_TRUE;
	  else
	    {
	      subexpr->next = ret->subexpr;
	      ret->subexpr = subexpr;
	    }
	}
      else if (subexpr->type != E_FALSE)
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	  answer = E_UNKNOWN;
	}
    }

  if (ret->subexpr == NULL)
    {
      parse_error(ls, "xor takes arguments!\n");
      return &false_bool_expr;   /* Default = FALSE */
    }

  if (answer == E_TRUE)
    return &true_bool_expr;
  else if (answer == E_FALSE)
    return &false_bool_expr;
  
  if (ret->subexpr->next == NULL && !odd_trues) /* (xor a) == a */
    return ret->subexpr;
  if (odd_trues)  /* If there were an odd number of TRUE's, toss one in. */
    {
      subexpr = create_bool_expr (E_TRUE, NULL);
      subexpr->next = ret->subexpr;
      ret->subexpr = subexpr;
    }
  
  return ret;
}